

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O2

WordEmbedding * __thiscall CoreML::Specification::Model::mutable_wordembedding(Model *this)

{
  WordEmbedding *this_00;
  
  if (this->_oneof_case_[0] == 0x7d5) {
    this_00 = (WordEmbedding *)(this->Type_).pipelineclassifier_;
  }
  else {
    clear_Type(this);
    this->_oneof_case_[0] = 0x7d5;
    this_00 = (WordEmbedding *)operator_new(0x28);
    CoreMLModels::WordEmbedding::WordEmbedding(this_00);
    (this->Type_).wordembedding_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::CoreMLModels::WordEmbedding* Model::mutable_wordembedding() {
  if (!has_wordembedding()) {
    clear_Type();
    set_has_wordembedding();
    Type_.wordembedding_ = new ::CoreML::Specification::CoreMLModels::WordEmbedding;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Model.wordEmbedding)
  return Type_.wordembedding_;
}